

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# extension_set.cc
# Opt level: O1

ExtensionInfo *
google::protobuf::internal::anon_unknown_58::FindRegisteredExtension
          (MessageLite *extendee,int number)

{
  char *pcVar1;
  MessageLite *pMVar2;
  uint uVar3;
  undefined1 auVar4 [16];
  undefined1 auVar5 [16];
  undefined1 auVar6 [16];
  undefined1 auVar7 [16];
  undefined1 auVar8 [16];
  undefined1 auVar9 [16];
  undefined1 auVar10 [16];
  undefined1 auVar11 [16];
  undefined1 auVar12 [16];
  undefined1 auVar13 [16];
  undefined1 auVar14 [16];
  char cVar15;
  undefined1 *puVar16;
  ulong uVar17;
  reference pEVar18;
  ulong uVar19;
  undefined1 uVar20;
  ulong uVar21;
  ulong uVar22;
  ushort uVar23;
  uint64_t v_2;
  ulong uVar24;
  uint uVar25;
  long lVar26;
  uint64_t v_4;
  undefined1 (*pauVar27) [16];
  uint64_t v_3;
  ulong uVar28;
  bool bVar29;
  bool bVar30;
  __m128i match;
  undefined1 auVar31 [16];
  undefined1 auVar32 [16];
  undefined1 auVar34 [16];
  const_iterator it;
  iterator local_50;
  const_iterator local_40;
  char cVar33;
  char cVar35;
  char cVar36;
  char cVar37;
  
  if ((anonymous_namespace)::global_registry != (ulong *)0x0) {
    local_50.ctrl_ = (ctrl_t *)(ulong)(uint)number;
    if (1 < (anonymous_namespace)::global_registry[1]) {
      auVar31._8_8_ = 0;
      auVar31._0_8_ =
           (long)&absl::lts_20240722::hash_internal::MixingHashState::kSeed + (long)extendee;
      auVar4._8_8_ = 0;
      auVar4._0_8_ = (long)&extendee->_vptr_MessageLite +
                     (SUB168(auVar31 * ZEXT816(0x9ddfea08eb382d69),0) ^
                     SUB168(auVar31 * ZEXT816(0x9ddfea08eb382d69),8));
      auVar5._8_8_ = 0;
      auVar5._0_8_ = local_50.ctrl_ +
                     (SUB168(auVar4 * ZEXT816(0x9ddfea08eb382d69),0) ^
                     SUB168(auVar4 * ZEXT816(0x9ddfea08eb382d69),8));
      uVar22 = *(anonymous_namespace)::global_registry;
      if (uVar22 < 0x11) {
        uVar21 = SUB168(auVar5 * ZEXT816(0x9ddfea08eb382d69),8) ^
                 SUB168(auVar5 * ZEXT816(0x9ddfea08eb382d69),0);
        pauVar27 = (undefined1 (*) [16])(anonymous_namespace)::global_registry[2];
        uVar24 = (anonymous_namespace)::global_registry[3];
        if (uVar22 < 0xf) {
          if (8 < uVar22) {
            __assert_fail("cap <= GroupPortableImpl::kWidth && \"unexpectedly large small capacity\""
                          ,
                          "/workspace/llm4binary/github/license_c_cmakelists/pybind[P]pybind11_protobuf/build_O1/_deps/absl-src/absl/container/internal/raw_hash_set.h"
                          ,0x753,
                          "void absl::container_internal::IterateOverFullSlots(const CommonFields &, SlotType *, Callback) [SlotType = google::protobuf::internal::ExtensionInfo, Callback = (lambda at /workspace/llm4binary/github/license_c_cmakelists/pybind[P]pybind11_protobuf/build_O1/_deps/absl-src/absl/container/internal/raw_hash_set.h:3842:36)]"
                         );
          }
          uVar22 = *(ulong *)(*pauVar27 + uVar22) & 0x8080808080808080;
          if (uVar22 != 0x8080808080808080) {
            uVar22 = uVar22 ^ 0x8080808080808080;
            do {
              uVar19 = 0;
              if (uVar22 != 0) {
                for (; (uVar22 >> uVar19 & 1) == 0; uVar19 = uVar19 + 1) {
                }
              }
              uVar19 = (ulong)(((uint)(uVar19 >> 3) & 0x1fffffff) * 0x30);
              pMVar2 = *(MessageLite **)((uVar24 - 0x30) + uVar19);
              uVar25 = *(uint *)((uVar24 - 0x28) + uVar19);
              if ((uVar25 == number && pMVar2 == extendee) &&
                 (auVar9._8_8_ = 0,
                 auVar9._0_8_ = (long)&absl::lts_20240722::hash_internal::MixingHashState::kSeed +
                                (long)pMVar2, auVar10._8_8_ = 0,
                 auVar10._0_8_ =
                      (long)&pMVar2->_vptr_MessageLite +
                      (SUB168(auVar9 * ZEXT816(0x9ddfea08eb382d69),0) ^
                      SUB168(auVar9 * ZEXT816(0x9ddfea08eb382d69),8)), auVar11._8_8_ = 0,
                 auVar11._0_8_ =
                      (SUB168(auVar10 * ZEXT816(0x9ddfea08eb382d69),0) ^
                      SUB168(auVar10 * ZEXT816(0x9ddfea08eb382d69),8)) + (ulong)uVar25,
                 uVar21 != (SUB168(auVar11 * ZEXT816(0x9ddfea08eb382d69),8) ^
                           SUB168(auVar11 * ZEXT816(0x9ddfea08eb382d69),0)))) {
LAB_00257a2d:
                __assert_fail("(!is_key_equal || is_hash_equal) && \"eq(k1, k2) must imply that hash(k1) == hash(k2). \" \"hash/eq functors are inconsistent.\""
                              ,
                              "/workspace/llm4binary/github/license_c_cmakelists/pybind[P]pybind11_protobuf/build_O1/_deps/absl-src/absl/container/internal/raw_hash_set.h"
                              ,0xf1b,
                              "auto absl::container_internal::raw_hash_set<absl::container_internal::FlatHashSetPolicy<google::protobuf::internal::ExtensionInfo>, google::protobuf::internal::(anonymous namespace)::ExtensionHasher, google::protobuf::internal::(anonymous namespace)::ExtensionEq, std::allocator<google::protobuf::internal::ExtensionInfo>>::AssertHashEqConsistent(const google::protobuf::internal::(anonymous namespace)::ExtensionInfoKey &)::(anonymous class)::operator()(const ctrl_t *, slot_type *) const [Policy = absl::container_internal::FlatHashSetPolicy<google::protobuf::internal::ExtensionInfo>, Hash = google::protobuf::internal::(anonymous namespace)::ExtensionHasher, Eq = google::protobuf::internal::(anonymous namespace)::ExtensionEq, Alloc = std::allocator<google::protobuf::internal::ExtensionInfo>]"
                             );
              }
              uVar22 = uVar22 & uVar22 - 1;
            } while (uVar22 != 0);
          }
        }
        else {
          uVar22 = (anonymous_namespace)::global_registry[1] >> 1;
          while( true ) {
            auVar31 = *pauVar27;
            uVar25 = (uint)(ushort)((ushort)(SUB161(auVar31 >> 7,0) & 1) |
                                    (ushort)(SUB161(auVar31 >> 0xf,0) & 1) << 1 |
                                    (ushort)(SUB161(auVar31 >> 0x17,0) & 1) << 2 |
                                    (ushort)(SUB161(auVar31 >> 0x1f,0) & 1) << 3 |
                                    (ushort)(SUB161(auVar31 >> 0x27,0) & 1) << 4 |
                                    (ushort)(SUB161(auVar31 >> 0x2f,0) & 1) << 5 |
                                    (ushort)(SUB161(auVar31 >> 0x37,0) & 1) << 6 |
                                    (ushort)(SUB161(auVar31 >> 0x3f,0) & 1) << 7 |
                                    (ushort)(SUB161(auVar31 >> 0x47,0) & 1) << 8 |
                                    (ushort)(SUB161(auVar31 >> 0x4f,0) & 1) << 9 |
                                    (ushort)(SUB161(auVar31 >> 0x57,0) & 1) << 10 |
                                    (ushort)(SUB161(auVar31 >> 0x5f,0) & 1) << 0xb |
                                    (ushort)(SUB161(auVar31 >> 0x67,0) & 1) << 0xc |
                                    (ushort)(SUB161(auVar31 >> 0x6f,0) & 1) << 0xd |
                                    (ushort)(SUB161(auVar31 >> 0x77,0) & 1) << 0xe |
                                   (ushort)(byte)(auVar31[0xf] >> 7) << 0xf);
            if (uVar25 != 0xffff) {
              uVar25 = ~uVar25;
              do {
                uVar3 = 0;
                if (uVar25 != 0) {
                  for (; (uVar25 >> uVar3 & 1) == 0; uVar3 = uVar3 + 1) {
                  }
                }
                if ((char)(*pauVar27)[uVar3] < '\0') {
                  __assert_fail("IsFull(ctrl[i]) && \"hash table was modified unexpectedly\"",
                                "/workspace/llm4binary/github/license_c_cmakelists/pybind[P]pybind11_protobuf/build_O1/_deps/absl-src/absl/container/internal/raw_hash_set.h"
                                ,0x764,
                                "void absl::container_internal::IterateOverFullSlots(const CommonFields &, SlotType *, Callback) [SlotType = google::protobuf::internal::ExtensionInfo, Callback = (lambda at /workspace/llm4binary/github/license_c_cmakelists/pybind[P]pybind11_protobuf/build_O1/_deps/absl-src/absl/container/internal/raw_hash_set.h:3842:36)]"
                               );
                }
                pMVar2 = *(MessageLite **)(uVar24 + uVar3 * 0x30);
                uVar3 = *(uint *)(uVar24 + 8 + (ulong)(uVar3 * 0x30));
                if ((uVar3 == number && pMVar2 == extendee) &&
                   (auVar12._8_8_ = 0,
                   auVar12._0_8_ =
                        (long)&absl::lts_20240722::hash_internal::MixingHashState::kSeed +
                        (long)pMVar2, auVar13._8_8_ = 0,
                   auVar13._0_8_ =
                        (long)&pMVar2->_vptr_MessageLite +
                        (SUB168(auVar12 * ZEXT816(0x9ddfea08eb382d69),0) ^
                        SUB168(auVar12 * ZEXT816(0x9ddfea08eb382d69),8)), auVar14._8_8_ = 0,
                   auVar14._0_8_ =
                        (SUB168(auVar13 * ZEXT816(0x9ddfea08eb382d69),0) ^
                        SUB168(auVar13 * ZEXT816(0x9ddfea08eb382d69),8)) + (ulong)uVar3,
                   uVar21 != (SUB168(auVar14 * ZEXT816(0x9ddfea08eb382d69),8) ^
                             SUB168(auVar14 * ZEXT816(0x9ddfea08eb382d69),0)))) goto LAB_00257a2d;
                uVar22 = uVar22 - 1;
                uVar23 = (ushort)(uVar25 - 1) & (ushort)uVar25;
                uVar25 = CONCAT22((short)(uVar25 - 1 >> 0x10),uVar23);
              } while (uVar23 != 0);
            }
            if (uVar22 == 0) break;
            uVar24 = uVar24 + 0x300;
            puVar16 = *pauVar27;
            pauVar27 = pauVar27 + 1;
            if (puVar16[0xf] == -1) {
              __assert_fail("(remaining == 0 || *(ctrl - 1) != ctrl_t::kSentinel) && \"hash table was modified unexpectedly\""
                            ,
                            "/workspace/llm4binary/github/license_c_cmakelists/pybind[P]pybind11_protobuf/build_O1/_deps/absl-src/absl/container/internal/raw_hash_set.h"
                            ,0x76b,
                            "void absl::container_internal::IterateOverFullSlots(const CommonFields &, SlotType *, Callback) [SlotType = google::protobuf::internal::ExtensionInfo, Callback = (lambda at /workspace/llm4binary/github/license_c_cmakelists/pybind[P]pybind11_protobuf/build_O1/_deps/absl-src/absl/container/internal/raw_hash_set.h:3842:36)]"
                           );
            }
          }
        }
      }
    }
    uVar22 = (anonymous_namespace)::global_registry[2];
    uVar24 = *(anonymous_namespace)::global_registry;
    if ((uVar24 + 1 & uVar24) != 0) {
      __assert_fail("((mask + 1) & mask) == 0 && \"not a mask\"",
                    "/workspace/llm4binary/github/license_c_cmakelists/pybind[P]pybind11_protobuf/build_O1/_deps/absl-src/absl/container/internal/raw_hash_set.h"
                    ,0x145,
                    "absl::container_internal::probe_seq<16>::probe_seq(size_t, size_t) [Width = 16]"
                   );
    }
    auVar6._8_8_ = 0;
    auVar6._0_8_ = (long)&absl::lts_20240722::hash_internal::MixingHashState::kSeed + (long)extendee
    ;
    auVar7._8_8_ = 0;
    auVar7._0_8_ = (long)&extendee->_vptr_MessageLite +
                   (SUB168(auVar6 * ZEXT816(0x9ddfea08eb382d69),0) ^
                   SUB168(auVar6 * ZEXT816(0x9ddfea08eb382d69),8));
    auVar8._8_8_ = 0;
    auVar8._0_8_ = local_50.ctrl_ +
                   (SUB168(auVar7 * ZEXT816(0x9ddfea08eb382d69),0) ^
                   SUB168(auVar7 * ZEXT816(0x9ddfea08eb382d69),8));
    uVar21 = SUB168(auVar8 * ZEXT816(0x9ddfea08eb382d69),8) ^
             SUB168(auVar8 * ZEXT816(0x9ddfea08eb382d69),0);
    local_50.field_1.slot_ = (slot_type *)(uVar22 >> 0xc);
    uVar17 = (uVar21 >> 7 ^ (ulong)local_50.field_1.slot_) & uVar24;
    uVar20 = (undefined1)uVar21;
    auVar31 = ZEXT216(CONCAT11(uVar20,uVar20) & 0x7f7f);
    auVar31 = pshuflw(auVar31,auVar31,0);
    uVar21 = (anonymous_namespace)::global_registry[3];
    uVar19 = 0;
    do {
      pcVar1 = (char *)(uVar22 + uVar17);
      cVar15 = pcVar1[0xf];
      cVar33 = auVar31[0];
      auVar34[0] = -(cVar33 == *pcVar1);
      cVar35 = auVar31[1];
      auVar34[1] = -(cVar35 == pcVar1[1]);
      cVar36 = auVar31[2];
      auVar34[2] = -(cVar36 == pcVar1[2]);
      cVar37 = auVar31[3];
      auVar34[3] = -(cVar37 == pcVar1[3]);
      auVar34[4] = -(cVar33 == pcVar1[4]);
      auVar34[5] = -(cVar35 == pcVar1[5]);
      auVar34[6] = -(cVar36 == pcVar1[6]);
      auVar34[7] = -(cVar37 == pcVar1[7]);
      auVar34[8] = -(cVar33 == pcVar1[8]);
      auVar34[9] = -(cVar35 == pcVar1[9]);
      auVar34[10] = -(cVar36 == pcVar1[10]);
      auVar34[0xb] = -(cVar37 == pcVar1[0xb]);
      auVar34[0xc] = -(cVar33 == pcVar1[0xc]);
      auVar34[0xd] = -(cVar35 == pcVar1[0xd]);
      auVar34[0xe] = -(cVar36 == pcVar1[0xe]);
      auVar34[0xf] = -(cVar37 == cVar15);
      uVar23 = (ushort)(SUB161(auVar34 >> 7,0) & 1) | (ushort)(SUB161(auVar34 >> 0xf,0) & 1) << 1 |
               (ushort)(SUB161(auVar34 >> 0x17,0) & 1) << 2 |
               (ushort)(SUB161(auVar34 >> 0x1f,0) & 1) << 3 |
               (ushort)(SUB161(auVar34 >> 0x27,0) & 1) << 4 |
               (ushort)(SUB161(auVar34 >> 0x2f,0) & 1) << 5 |
               (ushort)(SUB161(auVar34 >> 0x37,0) & 1) << 6 |
               (ushort)(SUB161(auVar34 >> 0x3f,0) & 1) << 7 |
               (ushort)(SUB161(auVar34 >> 0x47,0) & 1) << 8 |
               (ushort)(SUB161(auVar34 >> 0x4f,0) & 1) << 9 |
               (ushort)(SUB161(auVar34 >> 0x57,0) & 1) << 10 |
               (ushort)(SUB161(auVar34 >> 0x5f,0) & 1) << 0xb |
               (ushort)(SUB161(auVar34 >> 0x67,0) & 1) << 0xc |
               (ushort)(SUB161(auVar34 >> 0x6f,0) & 1) << 0xd |
               (ushort)(SUB161(auVar34 >> 0x77,0) & 1) << 0xe | (ushort)(auVar34[0xf] >> 7) << 0xf;
      uVar25 = (uint)uVar23;
      while (uVar23 != 0) {
        uVar3 = 0;
        if (uVar25 != 0) {
          for (; (uVar25 >> uVar3 & 1) == 0; uVar3 = uVar3 + 1) {
          }
        }
        uVar28 = uVar3 + uVar17 & uVar24;
        lVar26 = uVar28 * 0x30;
        bVar29 = *(MessageLite **)(uVar21 + lVar26) == extendee;
        bVar30 = *(int *)(uVar21 + 8 + lVar26) == number;
        if (bVar30 && bVar29) {
          if (uVar22 == 0) {
            __assert_fail("ctrl != nullptr",
                          "/workspace/llm4binary/github/license_c_cmakelists/pybind[P]pybind11_protobuf/build_O1/_deps/absl-src/absl/container/internal/raw_hash_set.h"
                          ,0x9c4,
                          "absl::container_internal::raw_hash_set<absl::container_internal::FlatHashSetPolicy<google::protobuf::internal::ExtensionInfo>, google::protobuf::internal::(anonymous namespace)::ExtensionHasher, google::protobuf::internal::(anonymous namespace)::ExtensionEq, std::allocator<google::protobuf::internal::ExtensionInfo>>::iterator::iterator(ctrl_t *, slot_type *, const GenerationType *) [Policy = absl::container_internal::FlatHashSetPolicy<google::protobuf::internal::ExtensionInfo>, Hash = google::protobuf::internal::(anonymous namespace)::ExtensionHasher, Eq = google::protobuf::internal::(anonymous namespace)::ExtensionEq, Alloc = std::allocator<google::protobuf::internal::ExtensionInfo>]"
                         );
          }
          local_50.field_1.slot_ = (slot_type *)(lVar26 + uVar21);
          local_50.ctrl_ = (ctrl_t *)(uVar28 + uVar22);
        }
        if (bVar30 && bVar29) break;
        uVar23 = (ushort)(uVar25 - 1) & (ushort)uVar25;
        uVar25 = CONCAT22((short)(uVar25 - 1 >> 0x10),uVar23);
      }
      if (uVar23 != 0) {
LAB_0025781b:
        bVar29 = false;
        uVar28 = uVar19;
      }
      else {
        auVar32[0] = -(*pcVar1 == -0x80);
        auVar32[1] = -(pcVar1[1] == -0x80);
        auVar32[2] = -(pcVar1[2] == -0x80);
        auVar32[3] = -(pcVar1[3] == -0x80);
        auVar32[4] = -(pcVar1[4] == -0x80);
        auVar32[5] = -(pcVar1[5] == -0x80);
        auVar32[6] = -(pcVar1[6] == -0x80);
        auVar32[7] = -(pcVar1[7] == -0x80);
        auVar32[8] = -(pcVar1[8] == -0x80);
        auVar32[9] = -(pcVar1[9] == -0x80);
        auVar32[10] = -(pcVar1[10] == -0x80);
        auVar32[0xb] = -(pcVar1[0xb] == -0x80);
        auVar32[0xc] = -(pcVar1[0xc] == -0x80);
        auVar32[0xd] = -(pcVar1[0xd] == -0x80);
        auVar32[0xe] = -(pcVar1[0xe] == -0x80);
        auVar32[0xf] = -(cVar15 == -0x80);
        if ((((((((((((((((auVar32 >> 7 & (undefined1  [16])0x1) != (undefined1  [16])0x0 ||
                         (auVar32 >> 0xf & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                        (auVar32 >> 0x17 & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                       (auVar32 >> 0x1f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                      (auVar32 >> 0x27 & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                     (auVar32 >> 0x2f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                    (auVar32 >> 0x37 & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                   (auVar32 >> 0x3f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                  (auVar32 >> 0x47 & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                 (auVar32 >> 0x4f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                (auVar32 >> 0x57 & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
               (auVar32 >> 0x5f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
              (auVar32 >> 0x67 & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
             (auVar32 >> 0x6f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
            (auVar32 >> 0x77 & (undefined1  [16])0x1) != (undefined1  [16])0x0) || cVar15 == -0x80)
        {
          local_50.ctrl_ = (ctrl_t *)0x0;
          goto LAB_0025781b;
        }
        uVar28 = uVar19 + 0x10;
        if (uVar24 < uVar28) {
          __assert_fail("seq.index() <= capacity() && \"full table!\"",
                        "/workspace/llm4binary/github/license_c_cmakelists/pybind[P]pybind11_protobuf/build_O1/_deps/absl-src/absl/container/internal/raw_hash_set.h"
                        ,0xdbd,
                        "iterator absl::container_internal::raw_hash_set<absl::container_internal::FlatHashSetPolicy<google::protobuf::internal::ExtensionInfo>, google::protobuf::internal::(anonymous namespace)::ExtensionHasher, google::protobuf::internal::(anonymous namespace)::ExtensionEq, std::allocator<google::protobuf::internal::ExtensionInfo>>::find_non_soo(const key_arg<K> &, size_t) [Policy = absl::container_internal::FlatHashSetPolicy<google::protobuf::internal::ExtensionInfo>, Hash = google::protobuf::internal::(anonymous namespace)::ExtensionHasher, Eq = google::protobuf::internal::(anonymous namespace)::ExtensionEq, Alloc = std::allocator<google::protobuf::internal::ExtensionInfo>, K = google::protobuf::internal::(anonymous namespace)::ExtensionInfoKey]"
                       );
        }
        uVar17 = uVar17 + uVar19 + 0x10 & uVar24;
        bVar29 = true;
      }
      uVar19 = uVar28;
    } while (bVar29);
    local_40.inner_.ctrl_ = (ctrl_t *)0x0;
    bVar29 = absl::lts_20240722::container_internal::operator==
                       ((const_iterator *)&local_50,&local_40);
    if (!bVar29) {
      pEVar18 = absl::lts_20240722::container_internal::
                raw_hash_set<absl::lts_20240722::container_internal::FlatHashSetPolicy<google::protobuf::internal::ExtensionInfo>,_google::protobuf::internal::(anonymous_namespace)::ExtensionHasher,_google::protobuf::internal::(anonymous_namespace)::ExtensionEq,_std::allocator<google::protobuf::internal::ExtensionInfo>_>
                ::iterator::operator*(&local_50);
      return pEVar18;
    }
  }
  return (ExtensionInfo *)0x0;
}

Assistant:

const ExtensionInfo* FindRegisteredExtension(const MessageLite* extendee,
                                             int number) {
  if (!global_registry) return nullptr;

  ExtensionInfoKey info;
  info.message = extendee;
  info.number = number;

  auto it = global_registry->find(info);
  if (it == global_registry->end()) {
    return nullptr;
  } else {
    return &*it;
  }
}